

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpool.h
# Opt level: O0

int __thiscall CVmPoolInMem::validate_ofs(CVmPoolInMem *this,pool_ofs_t ofs)

{
  size_t sVar1;
  size_t sVar2;
  pool_ofs_t in_ESI;
  CVmPoolPaged *in_RDI;
  size_t pgofs;
  size_t pg;
  bool local_21;
  
  sVar1 = CVmPoolPaged::get_page_for_ofs(in_RDI,in_ESI);
  sVar2 = CVmPoolPaged::get_ofs_for_ofs(in_RDI,in_ESI);
  local_21 = false;
  if ((sVar1 < in_RDI->page_slots_) && (local_21 = false, in_RDI->pages_[sVar1].mem != (char *)0x0))
  {
    local_21 = sVar2 < in_RDI->pages_[sVar1].siz;
  }
  return (int)local_21;
}

Assistant:

inline int validate_ofs(pool_ofs_t ofs)
    {
        /* get the page and the offset in the page */
        size_t pg = get_page_for_ofs(ofs);
        size_t pgofs = get_ofs_for_ofs(ofs);

        /* 
         *   to be valid, it must be within the range of valid pages, the
         *   page must be allocated, and the offset in the page must be
         *   within the page's actual allocated size 
         */
        return (pg < page_slots_
                && pages_[pg].mem != 0
                && pgofs < pages_[pg].siz);
    }